

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

void xmlDumpEntityDecl(xmlBufferPtr buf,xmlEntityPtr ent)

{
  xmlFreeFunc p_Var1;
  xmlParserErrors xVar2;
  xmlSaveCtxtPtr ctxt;
  xmlChar *pxVar3;
  xmlSaveCtxtPtr save;
  xmlEntityPtr ent_local;
  xmlBufferPtr buf_local;
  
  if ((buf != (xmlBufferPtr)0x0) && (ent != (xmlEntityPtr)0x0)) {
    ctxt = xmlSaveToBuffer(buf,(char *)0x0,0);
    xmlSaveTree(ctxt,(xmlNodePtr)ent);
    xVar2 = xmlSaveFinish(ctxt);
    p_Var1 = xmlFree;
    if (xVar2 != XML_ERR_OK) {
      pxVar3 = xmlBufferDetach(buf);
      (*p_Var1)(pxVar3);
    }
  }
  return;
}

Assistant:

void
xmlDumpEntityDecl(xmlBufferPtr buf, xmlEntityPtr ent) {
    xmlSaveCtxtPtr save;

    if ((buf == NULL) || (ent == NULL))
        return;

    save = xmlSaveToBuffer(buf, NULL, 0);
    xmlSaveTree(save, (xmlNodePtr) ent);
    if (xmlSaveFinish(save) != XML_ERR_OK)
        xmlFree(xmlBufferDetach(buf));
}